

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_trace_scan.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_trace_scan
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  int *piVar1;
  int iVar2;
  parasail_result_t *ppVar3;
  int *ptr;
  int *ptr_00;
  int *ptr_01;
  int *ptr_02;
  int *ptr_03;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  byte *pbVar10;
  byte *pbVar11;
  char *__format;
  int iVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  size_t size;
  byte *pbVar18;
  ulong size_00;
  undefined1 auVar19 [16];
  int local_88;
  ulong local_80;
  int *local_68;
  ulong local_58;
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar9 = "_s2";
  }
  else {
    local_58 = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      __format = "%s: %s must be > 0\n";
      pcVar9 = "s2Len";
    }
    else if (open < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar9 = "open";
    }
    else if (gap < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar9 = "gap";
    }
    else if (matrix == (parasail_matrix_t *)0x0) {
      __format = "%s: missing %s\n";
      pcVar9 = "matrix";
    }
    else {
      if (matrix->type != 0) {
        local_80 = (ulong)(uint)matrix->length;
LAB_00501d87:
        iVar17 = (int)local_80;
        ppVar3 = parasail_result_new_trace(iVar17,s2Len,0x10,1);
        if (ppVar3 == (parasail_result_t *)0x0) {
          return (parasail_result_t *)0x0;
        }
        ppVar3->flag = (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 |
                       (uint)(s2_beg != 0) << 0xe | (uint)(s2_end != 0) << 0xf | ppVar3->flag |
                       0x1480202;
        size_00 = (ulong)(uint)s2Len;
        ptr = parasail_memalign_int(0x10,size_00);
        ptr_00 = parasail_memalign_int(0x10,(long)(iVar17 + 1));
        size = (size_t)iVar17;
        ptr_01 = parasail_memalign_int(0x10,size);
        ptr_02 = parasail_memalign_int(0x10,(long)(iVar17 + 1));
        ptr_03 = parasail_memalign_int(0x10,size);
        auVar19._0_4_ = -(uint)((int)((ulong)ptr >> 0x20) == 0 && (int)ptr == 0);
        auVar19._4_4_ = -(uint)((int)ptr_00 == 0 && (int)((ulong)ptr_00 >> 0x20) == 0);
        auVar19._8_4_ = -(uint)((int)((ulong)ptr_01 >> 0x20) == 0 && (int)ptr_01 == 0);
        auVar19._12_4_ = -(uint)((int)ptr_02 == 0 && (int)((ulong)ptr_02 >> 0x20) == 0);
        iVar2 = movmskps((int)ptr_03,auVar19);
        if (iVar2 != 0) {
          return (parasail_result_t *)0x0;
        }
        if (ptr_03 == (int *)0x0) {
          return (parasail_result_t *)0x0;
        }
        pbVar18 = (byte *)((ppVar3->field_4).rowcols)->score_row;
        if (matrix->type == 0) {
          local_68 = parasail_memalign_int(0x10,size);
          uVar7 = 0;
          if (local_68 == (int *)0x0) {
            return (parasail_result_t *)0x0;
          }
          uVar8 = 0;
          if (0 < iVar17) {
            uVar8 = local_80;
          }
          for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
            local_68[uVar7] = matrix->mapper[(byte)_s1[uVar7]];
          }
        }
        else {
          local_68 = (int *)0x0;
        }
        piVar1 = matrix->mapper;
        for (uVar7 = 0; size_00 != uVar7; uVar7 = uVar7 + 1) {
          ptr[uVar7] = piVar1[(byte)_s2[uVar7]];
        }
        *ptr_00 = 0;
        *ptr_02 = 0;
        uVar7 = 0;
        if (0 < iVar17) {
          uVar7 = local_80;
        }
        if (s1_beg == 0) {
          iVar2 = -open;
          for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
            ptr_00[uVar8 + 1] = iVar2;
            iVar2 = iVar2 - gap;
          }
        }
        else {
          for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
            ptr_00[uVar8 + 1] = 0;
          }
        }
        for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
          ptr_01[uVar8] = -0x40000000;
        }
        uVar5 = s2Len - 1;
        uVar8 = (ulong)uVar5;
        uVar6 = iVar17 - 1;
        local_88 = -0x40000000;
        pbVar10 = pbVar18;
        for (uVar16 = 0; uVar16 != uVar8; uVar16 = uVar16 + 1) {
          pbVar11 = pbVar10;
          for (uVar14 = 0; uVar7 != uVar14; uVar14 = uVar14 + 1) {
            iVar2 = ptr_00[uVar14 + 1] - open;
            iVar12 = ptr_01[uVar14] - gap;
            iVar17 = iVar12;
            if (iVar12 <= iVar2) {
              iVar17 = iVar2;
            }
            ptr_01[uVar14] = iVar17;
            *pbVar11 = (iVar2 <= iVar12) * '\b' + 8;
            pbVar11 = pbVar11 + size_00;
          }
          iVar17 = -((int)uVar16 * gap + open);
          if (s2_beg != 0) {
            iVar17 = 0;
          }
          *ptr_02 = iVar17;
          for (uVar14 = 0; uVar7 != uVar14; uVar14 = uVar14 + 1) {
            if (matrix->type == 0) {
              iVar2 = local_68[uVar14];
            }
            else {
              iVar2 = (int)uVar14;
            }
            iVar12 = ptr_00[uVar14] +
                     matrix->matrix[(long)(matrix->size * iVar2) + (long)ptr[uVar16]];
            iVar2 = ptr_01[uVar14];
            if (ptr_01[uVar14] < iVar12) {
              iVar2 = iVar12;
            }
            ptr_02[uVar14 + 1] = iVar2;
            ptr_03[uVar14] = (uint)(iVar12 < ptr_01[uVar14]);
          }
          iVar2 = -0x40000000;
          pbVar11 = pbVar10;
          for (uVar14 = 0; uVar7 != uVar14; uVar14 = uVar14 + 1) {
            iVar12 = iVar2 - gap;
            iVar2 = ptr_02[uVar14];
            if (ptr_02[uVar14] <= iVar12) {
              iVar2 = iVar12;
            }
            iVar13 = iVar2 - open;
            *pbVar11 = *pbVar11 | (ptr_00[uVar14] <= iVar12) * ' ' + 0x20U;
            if (iVar13 < ptr_02[uVar14 + 1]) {
              ptr_00[uVar14 + 1] = ptr_02[uVar14 + 1];
              *pbVar11 = *pbVar11 | (ptr_03[uVar14] == 0) * '\x03' + 1U;
            }
            else {
              ptr_00[uVar14 + 1] = iVar13;
              if (ptr_02[uVar14 + 1] == iVar13) {
                if (ptr_03[uVar14] == 0) {
                  bVar4 = *pbVar11 | 4;
                }
                else {
                  bVar4 = *pbVar11 | 2;
                }
                *pbVar11 = bVar4;
              }
              else {
                *pbVar11 = *pbVar11 | 2;
              }
            }
            pbVar11 = pbVar11 + size_00;
          }
          *ptr_00 = iVar17;
          if ((s2_end != 0) && (local_88 < ptr_00[(long)(int)uVar6 + 1])) {
            local_80 = (ulong)uVar6;
            local_58 = uVar16 & 0xffffffff;
            local_88 = ptr_00[(long)(int)uVar6 + 1];
          }
          pbVar10 = pbVar10 + 1;
        }
        pbVar18 = pbVar18 + uVar8;
        pbVar10 = pbVar18;
        for (uVar16 = 0; uVar7 != uVar16; uVar16 = uVar16 + 1) {
          iVar2 = ptr_00[uVar16 + 1] - open;
          iVar12 = ptr_01[uVar16] - gap;
          iVar17 = iVar12;
          if (iVar12 <= iVar2) {
            iVar17 = iVar2;
          }
          ptr_01[uVar16] = iVar17;
          *pbVar10 = (iVar2 <= iVar12) * '\b' + 8;
          pbVar10 = pbVar10 + size_00;
        }
        iVar17 = -(uVar5 * gap + open);
        uVar16 = 0;
        if (s2_beg != 0) {
          iVar17 = 0;
        }
        *ptr_02 = iVar17;
        for (; uVar7 != uVar16; uVar16 = uVar16 + 1) {
          if (matrix->type == 0) {
            iVar17 = local_68[uVar16];
          }
          else {
            iVar17 = (int)uVar16;
          }
          iVar2 = ptr_00[uVar16] + matrix->matrix[(long)(matrix->size * iVar17) + (long)ptr[uVar8]];
          iVar17 = ptr_01[uVar16];
          if (ptr_01[uVar16] < iVar2) {
            iVar17 = iVar2;
          }
          ptr_02[uVar16 + 1] = iVar17;
          ptr_03[uVar16] = (uint)(iVar2 < ptr_01[uVar16]);
        }
        iVar17 = -0x40000000;
        uVar16 = 0;
        while( true ) {
          uVar15 = (uint)local_58;
          if (uVar7 == uVar16) break;
          iVar2 = iVar17 - gap;
          iVar17 = ptr_02[uVar16];
          if (ptr_02[uVar16] <= iVar2) {
            iVar17 = iVar2;
          }
          iVar12 = iVar17 - open;
          *pbVar18 = *pbVar18 | (ptr_00[uVar16] <= iVar2) * ' ' + 0x20U;
          if (iVar12 < ptr_02[uVar16 + 1]) {
            ptr_00[uVar16 + 1] = ptr_02[uVar16 + 1];
            *pbVar18 = *pbVar18 | (ptr_03[uVar16] == 0) * '\x03' + 1U;
          }
          else {
            ptr_00[uVar16 + 1] = iVar12;
            if (ptr_02[uVar16 + 1] == iVar12) {
              if (ptr_03[uVar16] == 0) {
                bVar4 = *pbVar18 | 4;
              }
              else {
                bVar4 = *pbVar18 | 2;
              }
              *pbVar18 = bVar4;
            }
            else {
              *pbVar18 = *pbVar18 | 2;
            }
          }
          if ((s1_end != 0) && (local_88 < ptr_00[uVar16 + 1])) {
            local_80 = uVar16 & 0xffffffff;
            local_58 = uVar8;
            local_88 = ptr_00[uVar16 + 1];
          }
          uVar16 = uVar16 + 1;
          pbVar18 = pbVar18 + size_00;
        }
        if ((s2_end != 0) && (local_88 < ptr_00[(long)(int)uVar6 + 1])) {
          uVar15 = uVar5;
          local_88 = ptr_00[(long)(int)uVar6 + 1];
          local_80._0_4_ = uVar6;
        }
        if (s2_end == 0 && s1_end == 0) {
          local_88 = ptr_00[(long)(int)uVar6 + 1];
          uVar15 = uVar5;
          local_80._0_4_ = uVar6;
        }
        ppVar3->score = local_88;
        ppVar3->end_query = (uint)local_80;
        ppVar3->end_ref = uVar15;
        parasail_free(ptr_03);
        parasail_free(ptr_02);
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(local_68);
          return ppVar3;
        }
        return ppVar3;
      }
      if (_s1 == (char *)0x0) {
        __format = "%s: missing %s\n";
        pcVar9 = "_s1";
      }
      else {
        local_80 = (ulong)(uint)_s1Len;
        if (0 < _s1Len) goto LAB_00501d87;
        __format = "%s: %s must be > 0\n";
        pcVar9 = "_s1Len";
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sg_flags_trace_scan",pcVar9);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * restrict HB = NULL;
    int * restrict H = NULL;
    int * restrict E = NULL;
    int * restrict HtB = NULL;
    int * restrict Ht = NULL;
    int8_t * restrict HT = NULL;
    int * restrict Ex = NULL;
    int i = 0;
    int j = 0;
    int s1Len = 0;
    int score = 0;
    int end_query = 0;
    int end_ref = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    i = 0;
    j = 0;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    score = NEG_INF_32;
    end_query = s1Len;
    end_ref = s2Len;

    /* initialize result */
    result = parasail_result_new_trace(s1Len, s2Len, 16, sizeof(int8_t));
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_NOVEC_SCAN
        | PARASAIL_FLAG_TRACE
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;

    /* initialize heap variables */
    s2 = parasail_memalign_int(16, s2Len);
    HB = parasail_memalign_int(16, s1Len+1);
    H  = HB+1;
    E  = parasail_memalign_int(16, s1Len);
    HtB= parasail_memalign_int(16, s1Len+1);
    Ht = HtB+1;
    Ex = parasail_memalign_int(16, s1Len);
    HT = (int8_t* restrict)result->trace->trace_table;

    /* validate heap variables */
    if (!s2) return NULL;
    if (!HB) return NULL;
    if (!E) return NULL;
    if (!HtB) return NULL;
    if (!Ex) return NULL;

    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int(16, s1Len);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
    }
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

    /* initialize H */
    H[-1] = 0;
    Ht[-1] = 0;
    if (s1_beg) {
        for (i=0; i<s1Len; ++i) {
            H[i] = 0;
        }
    }
    else {
        for (i=0; i<s1Len; ++i) {
            H[i] = -open -i*gap;
        }
    }

    /* initialize E */
    for (i=0; i<s1Len; ++i) {
        E[i] = NEG_INF_32;
    }

    /* iterate over database */
    for (j=0; j<s2Len-1; ++j) {
        int Ft = NEG_INF_32;
        /* calculate E */
        for (i=0; i<s1Len; ++i) {
            int E_opn = H[i]-open;
            int E_ext = E[i]-gap;
            E[i] = MAX(E_ext, E_opn);
            HT[1LL*i*s2Len + j] = (E_opn > E_ext) ? PARASAIL_DIAG_E
                                                  : PARASAIL_INS_E;
        }
        /* calculate Ht */
        Ht[-1] = s2_beg ? 0 : (-open -j*gap);
        for (i=0; i<s1Len; ++i) {
            int matval = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
                         matrix->matrix[matrix->size*s1[i]+s2[j]] :
                         matrix->matrix[matrix->size*i+s2[j]];
            int H_dag = H[i-1]+matval;
            Ht[i] = MAX(H_dag, E[i]);
            Ex[i] = (E[i] > H_dag);
        }
        /* calculate H */
        for (i=0; i<s1Len; ++i) {
            int Ft_opn;
            int Ht_pre = Ht[i-1];
            int Ft_ext = Ft-gap;
            if (Ht_pre >= Ft_ext) {
                Ft = Ht_pre;
            }
            else {
                Ft = Ft_ext;
            }
            Ft_opn = Ft-open;
            if (H[i-1] > Ft_ext) {
                HT[1LL*i*s2Len + j] |= PARASAIL_DIAG_F;
            }
            else {
                HT[1LL*i*s2Len + j] |= PARASAIL_DEL_F;
            }
            if (Ht[i] > Ft_opn) {
                H[i] = Ht[i];
                HT[1LL*i*s2Len + j] |= Ex[i] ? PARASAIL_INS : PARASAIL_DIAG;
            }
            else {
                H[i] = Ft_opn;
                if (Ht[i] == Ft_opn) {
                    if (Ex[i]) {
                        HT[1LL*i*s2Len + j] |= PARASAIL_DEL;
                    }
                    else {
                        HT[1LL*i*s2Len + j] |= PARASAIL_DIAG;
                    }
                }
                else {
                    HT[1LL*i*s2Len + j] |= PARASAIL_DEL;
                }
            }
        }
        H[-1] = s2_beg ? 0 : (-open - j*gap);
        if (s2_end && H[s1Len-1] > score) {
            score = H[s1Len-1];
            end_query = s1Len-1;
            end_ref = j;
        }
    }
    j = s2Len - 1;
    {
        int Ft = NEG_INF_32;
        /* calculate E */
        for (i=0; i<s1Len; ++i) {
            int E_opn = H[i]-open;
            int E_ext = E[i]-gap;
            E[i] = MAX(E_ext, E_opn);
            HT[1LL*i*s2Len + j] = (E_opn > E_ext) ? PARASAIL_DIAG_E
                                                  : PARASAIL_INS_E;
        }
        /* calculate Ht */
        Ht[-1] = s2_beg ? 0 : (-open -j*gap);
        for (i=0; i<s1Len; ++i) {
            int matval = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
                         matrix->matrix[matrix->size*s1[i]+s2[j]] :
                         matrix->matrix[matrix->size*i+s2[j]];
            int H_dag = H[i-1]+matval;
            Ht[i] = MAX(H_dag, E[i]);
            Ex[i] = (E[i] > H_dag);
        }
        /* calculate H */
        for (i=0; i<s1Len; ++i) {
            int Ft_opn;
            int Ht_pre = Ht[i-1];
            int Ft_ext = Ft-gap;
            if (Ht_pre >= Ft_ext) {
                Ft = Ht_pre;
            }
            else {
                Ft = Ft_ext;
            }
            Ft_opn = Ft-open;
            if (H[i-1] > Ft_ext) {
                HT[1LL*i*s2Len + j] |= PARASAIL_DIAG_F;
            }
            else {
                HT[1LL*i*s2Len + j] |= PARASAIL_DEL_F;
            }
            if (Ht[i] > Ft_opn) {
                H[i] = Ht[i];
                HT[1LL*i*s2Len + j] |= Ex[i] ? PARASAIL_INS : PARASAIL_DIAG;
            }
            else {
                H[i] = Ft_opn;
                if (Ht[i] == Ft_opn) {
                    if (Ex[i]) {
                        HT[1LL*i*s2Len + j] |= PARASAIL_DEL;
                    }
                    else {
                        HT[1LL*i*s2Len + j] |= PARASAIL_DIAG;
                    }
                }
                else {
                    HT[1LL*i*s2Len + j] |= PARASAIL_DEL;
                }
            }
            if (s1_end && H[i] > score) {
                score = H[i];
                end_query = i;
                end_ref = j;
            }
        }
    }
    if (s2_end && H[s1Len-1] > score) {
        score = H[s1Len-1];
        end_query = s1Len-1;
        end_ref = s2Len-1;
    }
    if (!s1_end && !s2_end) {
        score = H[s1Len-1];
        end_query = s1Len-1;
        end_ref = s2Len-1;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(Ex);
    parasail_free(HtB);
    parasail_free(E);
    parasail_free(HB);
    parasail_free(s2);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}